

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O1

int Molecular_Dynamics(double (*x) [3],double (*A) [3],double *ham_init,double *ham_fin)

{
  int idim_1;
  int iVar1;
  double (*padVar2) [3];
  int idim;
  long lVar3;
  long lVar4;
  double dVar5;
  double delh [3];
  double p [3];
  double r1;
  double r2;
  double local_88 [4];
  double adStack_68 [4];
  double *local_48;
  double local_40;
  double local_38;
  
  lVar3 = 0;
  local_48 = ham_fin;
  do {
    BoxMuller(&local_40,&local_38);
    adStack_68[lVar3] = local_40;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  dVar5 = calc_action(*x,A);
  lVar3 = 0;
  do {
    dVar5 = dVar5 + adStack_68[lVar3] * 0.5 * adStack_68[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  *ham_init = dVar5;
  lVar3 = 0;
  do {
    (*x)[lVar3] = adStack_68[lVar3] * 0.5 + (*x)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  iVar1 = 1;
  do {
    local_88[0] = 0.0;
    local_88[1] = 0.0;
    local_88[2] = 0.0;
    lVar3 = 0;
    padVar2 = A;
    do {
      dVar5 = local_88[lVar3];
      lVar4 = 0;
      do {
        dVar5 = dVar5 + (*padVar2)[lVar4] * (*x)[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_88[lVar3] = dVar5;
      lVar3 = lVar3 + 1;
      padVar2 = padVar2 + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      adStack_68[lVar3] = adStack_68[lVar3] - local_88[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      (*x)[lVar3] = adStack_68[lVar3] + (*x)[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x28);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar3 = 0;
  padVar2 = A;
  do {
    dVar5 = local_88[lVar3];
    lVar4 = 0;
    do {
      dVar5 = dVar5 + (*padVar2)[lVar4] * (*x)[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_88[lVar3] = dVar5;
    lVar3 = lVar3 + 1;
    padVar2 = padVar2 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    adStack_68[lVar3] = adStack_68[lVar3] - local_88[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    (*x)[lVar3] = adStack_68[lVar3] * 0.5 + (*x)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  dVar5 = calc_action(*x,A);
  lVar3 = 0;
  do {
    dVar5 = dVar5 + adStack_68[lVar3] * 0.5 * adStack_68[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  *local_48 = dVar5;
  return 0;
}

Assistant:

int Molecular_Dynamics(double (&x)[ndim], const double A[ndim][ndim], double &ham_init,
                       double &ham_fin) {
    double p[ndim];
    double delh[ndim];
    double r1, r2;
    for (int idim = 0; idim < ndim; idim++) {
        BoxMuller(r1, r2);
        p[idim] = r1;
    }
    ham_init = calc_hamiltonian(x, p, A);

    for (int idim = 0; idim < ndim; idim++) {
        x[idim] += p[idim] * 0.5e0 * dtau;
    }

    for (int step = 1; step < ntau; step++) {
        calc_delh(x, A, delh);
        for (int idim = 0; idim < ndim; idim++) {
            p[idim] -= delh[idim] * dtau;
        }
        for (int idim = 0; idim < ndim; idim++) {
            x[idim] += p[idim] * dtau;
        }
    }
    calc_delh(x, A, delh);
    for (int idim = 0; idim < ndim; idim++) {
        p[idim] -= delh[idim] * dtau;
    }
    for (int idim = 0; idim < ndim; idim++) {
        x[idim] += p[idim] * 0.5e0 * dtau;
    }

    ham_fin = calc_hamiltonian(x, p, A);
    return 0;
}